

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O1

void __thiscall UnitTest_semantic12::UnitTest_semantic12(UnitTest_semantic12 *this)

{
  UnitTestBase::UnitTestBase(&this->super_UnitTestBase);
  (this->super_UnitTestBase)._vptr_UnitTestBase = (_func_int **)&PTR_Run_00187408;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_UnitTestBase).test_name_,0,
             (char *)(this->super_UnitTestBase).test_name_._M_string_length,0x16874d);
  return;
}

Assistant:

TEST_CASE(semantic12)
{
    EXPECT_TRUE(Semantic("a = -(1 + 1)"));
    EXPECT_TRUE(Semantic("a = #{1, 2, 3}"));
    EXPECT_TRUE(Semantic("a = #'str'"));
    EXPECT_TRUE(Semantic("a = not a"));
    EXPECT_TRUE(Semantic("a = -a"));
    EXPECT_TRUE(Semantic("a = #a"));
    EXPECT_EXCEPTION(luna::SemanticException, {
        Semantic("a = -'str'");
    });
    EXPECT_EXCEPTION(luna::SemanticException, {
        Semantic("a = #1");
    });
}